

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O1

void test_parallel_for_task(void)

{
  uint64_t uid;
  bool bVar1;
  undefined4 uVar2;
  int32_t __val;
  int32_t __val_00;
  element_type *peVar3;
  long lVar4;
  uint uVar5;
  undefined8 *puVar6;
  long *plVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  timing_registry *this;
  uint uVar9;
  size_type *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *ppVar12;
  __pthread_internal_list *p_Var13;
  __pthread_internal_list *p_Var14;
  undefined8 uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  uint uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  test __t;
  undefined1 local_170 [36];
  uint __uval;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  undefined1 local_140 [24];
  char local_128 [16];
  __pthread_internal_list local_118;
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  string __str_1;
  undefined1 local_d8 [36];
  simple_partitioner partitioner;
  string __str;
  shared_ptr<oqpi::simple_partitioner> spPartitioner;
  task_handle *local_68;
  _Elt_pointer local_60;
  task_handle local_58;
  task_handle local_48;
  undefined8 local_38;
  
  test::test(&__t,"test_parallel_for_task");
  partitioner.super_base_partitioner.firstIndex_ = 0;
  partitioner.super_base_partitioner.lastIndex_ = gTaskCount;
  partitioner.super_base_partitioner.elementCount_ = gTaskCount;
  if (gTaskCount <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    partitioner.nbElementsPerBatch_ = 1;
    partitioner.remainder_ = 0;
    partitioner.super_base_partitioner.batchCount_ = gTaskCount;
  }
  else {
    partitioner.nbElementsPerBatch_ =
         gTaskCount /
         (int)oqpi::
              helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
              ::scheduler_._32_4_;
    partitioner.remainder_ =
         gTaskCount %
         (int)oqpi::
              helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
              ::scheduler_._32_4_;
    partitioner.super_base_partitioner.batchCount_ =
         oqpi::
         helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
         ::scheduler_._32_4_;
  }
  partitioner.batchIndex_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"FibonacciParallelForGroup","");
  __val_00 = partitioner.super_base_partitioner.batchCount_;
  __val = partitioner.super_base_partitioner.elementCount_;
  if (partitioner.super_base_partitioner.elementCount_ < 1) {
    _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ppVar12 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
    goto LAB_0016acd6;
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8);
  local_148._M_pi = p_Var8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_68,
             (long)&(local_68->spTask_).
                    super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             (long)&(local_60->spTask_).
                    super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::append((char *)&local_148);
  uVar17 = 1;
  if (9 < (uint)__val) {
    uVar9 = __val;
    uVar5 = 4;
    do {
      uVar17 = uVar5;
      if (uVar9 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0016a624;
      }
      if (uVar9 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0016a624;
      }
      if (uVar9 < 10000) goto LAB_0016a624;
      bVar1 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      uVar5 = uVar17 + 4;
    } while (bVar1);
    uVar17 = uVar17 + 1;
  }
LAB_0016a624:
  local_128._0_8_ = &local_118;
  std::__cxx11::string::_M_construct((ulong)local_128,(char)uVar17);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_128._0_8_,uVar17,__val);
  p_Var14 = (__pthread_internal_list *)
            ((long)(__pthread_internal_list **)local_128._8_8_ + local_140._0_8_);
  p_Var13 = (__pthread_internal_list *)0xf;
  if (local_148._M_pi != p_Var8) {
    p_Var13 = (__pthread_internal_list *)local_140._8_8_;
  }
  if (p_Var13 < p_Var14) {
    p_Var13 = (__pthread_internal_list *)0xf;
    if ((__pthread_internal_list *)local_128._0_8_ != &local_118) {
      p_Var13 = local_118.__prev;
    }
    if (p_Var13 < p_Var14) goto LAB_0016a68b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,(ulong)local_148._M_pi);
  }
  else {
LAB_0016a68b:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,local_128._0_8_);
  }
  local_170._0_8_ = local_170 + 0x10;
  psVar10 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar10) {
    local_170._16_8_ = *psVar10;
    local_170._24_8_ = puVar6[3];
  }
  else {
    local_170._16_8_ = *psVar10;
    local_170._0_8_ = (size_type *)*puVar6;
  }
  local_170._8_8_ = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_170);
  local_d8._0_8_ = local_d8 + 0x10;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_d8._16_8_ = *psVar10;
    local_d8._24_8_ = plVar7[3];
  }
  else {
    local_d8._16_8_ = *psVar10;
    local_d8._0_8_ = (size_type *)*plVar7;
  }
  local_d8._8_8_ = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
  }
  if ((__pthread_internal_list *)local_128._0_8_ != &local_118) {
    operator_delete((void *)local_128._0_8_,(ulong)((long)&(local_118.__prev)->__prev + 1));
  }
  if (local_148._M_pi != p_Var8) {
    operator_delete(local_148._M_pi,(ulong)(local_140._8_8_ + 1));
  }
  __str._M_dataplus._M_p._0_1_ = 2;
  local_170._0_4_ = __val_00;
  local_148._M_pi = local_148._M_pi & 0xffffffff00000000;
  local_108 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,std::allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>,oqpi::scheduler<concurrent_queue>&,std::__cxx11::string_const&,oqpi::task_priority&,int&,int&>
            (&_Stack_100,&local_108,
             (allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)local_128,
             (scheduler<concurrent_queue> *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (task_priority *)&__str,(int *)local_170,(int *)&local_148);
  std::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
  ::
  _M_enable_shared_from_this_with<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>
            ((__shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_108,local_108);
  spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oqpi::simple_partitioner,std::allocator<oqpi::simple_partitioner>,oqpi::simple_partitioner_const&>
            (&spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(simple_partitioner **)&spPartitioner,
             (allocator<oqpi::simple_partitioner> *)local_170,&partitioner);
  if (0 < __val_00) {
    p_Var14 = (__pthread_internal_list *)0x0;
    do {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8);
      __uval = (uint)p_Var14 + 1;
      uVar17 = 1;
      if (8 < (uint)p_Var14) {
        uVar9 = __uval;
        uVar5 = 4;
        do {
          uVar17 = uVar5;
          if (uVar9 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0016a88d;
          }
          if (uVar9 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0016a88d;
          }
          if (uVar9 < 10000) goto LAB_0016a88d;
          bVar1 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          uVar5 = uVar17 + 4;
        } while (bVar1);
        uVar17 = uVar17 + 1;
      }
LAB_0016a88d:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      local_38 = p_Var14;
      std::__cxx11::string::_M_construct((ulong)&__str,(char)uVar17);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,uVar17,__uval);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x1c989b);
      p_Var14 = (__pthread_internal_list *)(plVar7 + 2);
      if ((__pthread_internal_list *)*plVar7 == p_Var14) {
        local_118.__prev = p_Var14->__prev;
        local_118.__next = (__pthread_internal_list *)plVar7[3];
        local_128._0_8_ = &local_118;
      }
      else {
        local_118.__prev = p_Var14->__prev;
        local_128._0_8_ = (__pthread_internal_list *)*plVar7;
      }
      local_128._8_8_ = plVar7[1];
      *plVar7 = (long)p_Var14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_128);
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar7 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7 == p_Var11) {
        local_140._8_8_ = p_Var11->_vptr__Sp_counted_base;
        local_140._16_8_ = plVar7[3];
        local_148._M_pi = p_Var8;
      }
      else {
        local_140._8_8_ = p_Var11->_vptr__Sp_counted_base;
        local_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7;
      }
      local_140._0_8_ = plVar7[1];
      *plVar7 = (long)p_Var11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar17 = 1;
      if (9 < (uint)__val_00) {
        uVar9 = 4;
        uVar5 = __val_00;
        do {
          uVar17 = uVar9;
          if (uVar5 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0016a9ca;
          }
          if (uVar5 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0016a9ca;
          }
          if (uVar5 < 10000) goto LAB_0016a9ca;
          bVar1 = 99999 < uVar5;
          uVar9 = uVar17 + 4;
          uVar5 = uVar5 / 10000;
        } while (bVar1);
        uVar17 = uVar17 + 1;
      }
LAB_0016a9ca:
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_1,(char)uVar17);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str_1._M_dataplus._M_p,uVar17,__val_00);
      p_Var14 = (__pthread_internal_list *)0xf;
      if (local_148._M_pi != p_Var8) {
        p_Var14 = (__pthread_internal_list *)local_140._8_8_;
      }
      if (p_Var14 < (__pthread_internal_list *)(__str_1._M_string_length + local_140._0_8_)) {
        uVar15 = (__pthread_internal_list *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          uVar15 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < (__pthread_internal_list *)(__str_1._M_string_length + local_140._0_8_))
        goto LAB_0016aa4f;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,(ulong)local_148._M_pi)
        ;
      }
      else {
LAB_0016aa4f:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_148,(ulong)__str_1._M_dataplus._M_p)
        ;
      }
      psVar10 = puVar6 + 2;
      if ((size_type *)*puVar6 == psVar10) {
        local_170._16_8_ = *psVar10;
        local_170._24_8_ = puVar6[3];
        local_170._0_8_ = local_170 + 0x10;
      }
      else {
        local_170._16_8_ = *psVar10;
        local_170._0_8_ = (size_type *)*puVar6;
      }
      local_170._8_8_ = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      if (local_148._M_pi != p_Var8) {
        operator_delete(local_148._M_pi,(ulong)(local_140._8_8_ + 1));
      }
      if ((__pthread_internal_list *)local_128._0_8_ != &local_118) {
        operator_delete((void *)local_128._0_8_,(ulong)((long)&(local_118.__prev)->__prev + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      _Var16._M_pi = spPartitioner.
                     super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      peVar3 = spPartitioner.
               super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var8->_M_use_count = 1;
      p_Var8->_M_weak_count = 1;
      p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f91b0;
      p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_001f9078;
      LOCK();
      UNLOCK();
      uVar2 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar4 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var8[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar4;
      p_Var8[1]._M_weak_count = uVar2;
      p_Var8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var8[2]._M_use_count = 0;
      p_Var8[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var8[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var8[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f9200;
      *(element_type **)&p_Var8[3]._M_use_count = (element_type *)(p_Var8 + 1);
      this = timing_registry::get();
      uid._0_4_ = p_Var8[1]._M_use_count;
      uid._4_4_ = p_Var8[1]._M_weak_count;
      timing_registry::registerTask(this,uid,(string *)local_170);
      p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f9200;
      *(int *)&p_Var8[4]._vptr__Sp_counted_base = (int)local_38;
      *(element_type **)&p_Var8[4]._M_use_count = peVar3;
      p_Var8[5]._vptr__Sp_counted_base = (_func_int **)_Var16._M_pi;
      local_48.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var8 + 1);
      local_48.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var8;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask(&local_108->
                 super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                ,&local_48);
      if (local_48.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
        operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
      }
      p_Var14 = (__pthread_internal_list *)(ulong)__uval;
    } while (__uval != __val_00);
  }
  _Var16._M_pi = _Stack_100._M_pi;
  ppVar12 = local_108;
  local_108 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
  _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (spPartitioner.
               super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
LAB_0016acd6:
  if (local_68 != &local_58) {
    operator_delete(local_68,(ulong)((long)&(local_58.spTask_.
                                             super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->_vptr_task_base + 1));
  }
  if (_Var16._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var16._M_pi)->_M_use_count = (_Var16._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var16._M_pi)->_M_use_count = (_Var16._M_pi)->_M_use_count + 1;
    }
  }
  local_d8._0_8_ = ppVar12;
  local_d8._8_8_ = _Var16._M_pi;
  oqpi::scheduler<concurrent_queue>::add
            ((scheduler<concurrent_queue> *)local_170,
             (task_handle *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  oqpi::task_handle::validate((task_handle *)local_170);
  (**(code **)(*(long *)local_170._0_8_ + 0x20))();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
  }
  if (_Var16._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var16._M_pi);
  }
  test::~test(&__t);
  return;
}

Assistant:

void test_parallel_for_task()
{
    TEST_FUNC;

    const auto prio = oqpi::task_priority::normal;
    const auto partitioner = oqpi::simple_partitioner(gTaskCount, oqpi_tk::scheduler().workersCount(prio));
    auto spParallelForGroup = oqpi_tk::make_parallel_for_task_group<oqpi::task_type::waitable>("FibonacciParallelForGroup", partitioner, prio,
        [](int32_t i)
    {
        volatile auto a = 0ull;
        a += fibonacci(gValue + a);
        a += i;
    });
    oqpi_tk::schedule_task(oqpi::task_handle(spParallelForGroup)).wait();
}